

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

f32 wabt::interp::Convert<float,double>(f64 val)

{
  uint uVar1;
  float fVar2;
  __type_conflict _Var3;
  bool local_2b;
  bool local_2a;
  bool local_29;
  f64 kMax;
  f64 kMin;
  f64 val_local;
  
  local_29 = -3.4028234663852886e+38 <= (double)val && (double)val <= 3.4028234663852886e+38;
  if (local_29) {
    val_local._4_4_ = (float)(double)val;
  }
  else {
    local_2a = 3.4028234663852886e+38 < (double)val && (double)val < 3.4028235677973366e+38;
    if (local_2a) {
      val_local._4_4_ = std::numeric_limits<float>::max();
    }
    else {
      local_2b = -3.4028235677973366e+38 < (double)val && (double)val < -3.4028234663852886e+38;
      if (local_2b) {
        fVar2 = std::numeric_limits<float>::max();
        val_local._4_4_ = -fVar2;
      }
      else {
        uVar1 = std::isnan((double)val);
        if ((uVar1 & 1) == 0) {
          fVar2 = std::numeric_limits<float>::infinity();
          _Var3 = std::copysign<float,double>(fVar2,(double)val);
          val_local._4_4_ = (float)_Var3;
        }
        else {
          val_local._4_4_ = std::numeric_limits<float>::quiet_NaN();
        }
      }
    }
  }
  return (f32)val_local._4_4_;
}

Assistant:

inline f32 WABT_VECTORCALL Convert(f64 val) {
  // The WebAssembly rounding mode means that these values (which are > F32_MAX)
  // should be rounded to F32_MAX and not set to infinity. Unfortunately, UBSAN
  // complains that the value is not representable as a float, so we'll special
  // case them.
  const f64 kMin = 3.4028234663852886e38;
  const f64 kMax = 3.4028235677973366e38;
  if (WABT_LIKELY(val >= -kMin && val <= kMin)) {
    return val;
  } else if (WABT_UNLIKELY(val > kMin && val < kMax)) {
    return std::numeric_limits<f32>::max();
  } else if (WABT_UNLIKELY(val > -kMax && val < -kMin)) {
    return -std::numeric_limits<f32>::max();
  } else if (WABT_UNLIKELY(std::isnan(val))) {
    return std::numeric_limits<f32>::quiet_NaN();
  } else {
    return std::copysign(std::numeric_limits<f32>::infinity(), val);
  }
}